

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O2

void __thiscall
CHog::initialHist(CHog *this,int _imgWidth,int _imgHeight,int _imgChannel,int _windowWidth,
                 int _windowHeight,int _numOriHalf,int _numOriFull,int _cellSize)

{
  size_t __n;
  undefined1 auVar1 [16];
  int iVar2;
  histCell **pphVar3;
  ulong uVar4;
  ulong uVar5;
  histCell *phVar6;
  void *pvVar7;
  int **ppiVar8;
  int *piVar9;
  ostream *poVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int x;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int y;
  long lVar17;
  ulong uVar18;
  size_t sVar19;
  
  if ((_windowWidth % _cellSize == 0) &&
     (iVar2 = _windowHeight / _cellSize, _windowHeight % _cellSize == 0)) {
    this->cellSize = _cellSize;
    this->windowHeight = _windowHeight;
    this->windowWidth = _windowWidth;
    this->numCellX = _windowWidth / _cellSize;
    this->numCellY = iVar2;
    iVar13 = _windowWidth / _cellSize + 2;
    this->histSizeX = iVar13;
    uVar15 = (ulong)(iVar2 + 2U);
    this->histSizeY = iVar2 + 2U;
    this->imgWidth = _imgWidth;
    this->imgHeight = _imgHeight;
    this->imgChannel = _imgChannel;
    this->widthStep = _imgChannel * _imgWidth;
    uVar5 = 0xffffffffffffffff;
    uVar18 = uVar15 * 8;
    if (iVar2 < -2) {
      uVar18 = uVar5;
    }
    pphVar3 = (histCell **)operator_new__(uVar18);
    uVar18 = (ulong)(uint)_numOriFull << 3;
    if (_numOriFull < 0) {
      uVar18 = uVar5;
    }
    this->hist = pphVar3;
    uVar4 = (ulong)(uint)_numOriHalf << 3;
    if (_numOriHalf < 0) {
      uVar4 = uVar5;
    }
    uVar11 = _numOriFull + _numOriHalf + 4;
    uVar12 = (ulong)uVar11 * 8;
    if (_numOriFull + _numOriHalf < -4) {
      uVar12 = uVar5;
    }
    for (lVar17 = 0; lVar17 < (int)uVar15; lVar17 = lVar17 + 1) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar13;
      uVar5 = SUB168(auVar1 * ZEXT816(0x30),0);
      if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      phVar6 = (histCell *)operator_new__(uVar5);
      this->hist[lVar17] = phVar6;
      lVar16 = 0;
      for (lVar14 = 0; lVar14 < iVar13; lVar14 = lVar14 + 1) {
        pvVar7 = operator_new__(uVar18);
        pphVar3 = this->hist;
        *(void **)((long)&pphVar3[lVar17]->cellBinsFull + lVar16) = pvVar7;
        pvVar7 = operator_new__(uVar4);
        *(void **)((long)&pphVar3[lVar17]->cellBinsHalf + lVar16) = pvVar7;
        *(uint *)((long)&pphVar3[lVar17]->dim + lVar16) = uVar11;
        pvVar7 = operator_new__(uVar12);
        *(void **)((long)&pphVar3[lVar17]->feat + lVar16) = pvVar7;
        phVar6 = pphVar3[lVar17];
        *(int *)((long)&phVar6->numOriFull + lVar16) = _numOriFull;
        *(int *)((long)&phVar6->numOriHalf + lVar16) = _numOriHalf;
        *(undefined8 *)((long)&phVar6->normFactorHalf + lVar16) = 0;
        memset(*(void **)((long)&phVar6->cellBinsFull + lVar16),0,(long)_numOriFull << 3);
        memset(*(void **)((long)&this->hist[lVar17]->cellBinsHalf + lVar16),0,
               (long)*(int *)((long)&this->hist[lVar17]->numOriHalf + lVar16) << 3);
        memset(*(void **)((long)&this->hist[lVar17]->feat + lVar16),0,
               (long)*(int *)((long)&this->hist[lVar17]->dim + lVar16) << 3);
        iVar13 = this->histSizeX;
        lVar16 = lVar16 + 0x30;
      }
      uVar15 = (ulong)(uint)this->histSizeY;
    }
    uVar18 = (ulong)this->imgHeight;
    uVar5 = uVar18 * 8;
    if ((long)uVar18 < 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppiVar8 = (int **)operator_new__(uVar5);
    this->dx = ppiVar8;
    ppiVar8 = (int **)operator_new__(uVar5);
    this->dy = ppiVar8;
    for (lVar17 = 0; lVar17 < (int)uVar18; lVar17 = lVar17 + 1) {
      __n = (long)this->imgWidth * 4;
      sVar19 = __n;
      if ((long)this->imgWidth < 0) {
        sVar19 = 0xffffffffffffffff;
      }
      piVar9 = (int *)operator_new__(sVar19);
      this->dx[lVar17] = piVar9;
      piVar9 = (int *)operator_new__(sVar19);
      this->dy[lVar17] = piVar9;
      memset(this->dx[lVar17],0,__n);
      memset(this->dy[lVar17],0,(long)this->imgWidth << 2);
      uVar18 = (ulong)(uint)this->imgHeight;
    }
    return;
  }
  poVar10 = std::operator<<((ostream *)&std::cout,"image size is not N*cellSize");
  std::endl<char,std::char_traits<char>>(poVar10);
  exit(0);
}

Assistant:

void CHog::initialHist(int _imgWidth,
                       int _imgHeight,
                       int _imgChannel,
                       int _windowWidth,
                       int _windowHeight,
                       int _numOriHalf, //方向量化个数
                       int _numOriFull,
                       int _cellSize) //cell尺寸
{
    //cout<<"hog hist intializing"<<endl;
    if(_windowWidth%_cellSize!=0 || _windowHeight%_cellSize!=0)  //判断图像尺寸是否是cell尺寸的整倍数
    {
        cout<<"image size is not N*cellSize"<<endl;
        exit(0);
    }
    cellSize = _cellSize;
    windowHeight = _windowHeight;
    windowWidth = _windowWidth;
    numCellX = _windowWidth/cellSize;
    numCellY = _windowHeight/cellSize;
    histSizeX = numCellX + 2;
    histSizeY = numCellY + 2;
    imgWidth = _imgWidth;
    imgHeight = _imgHeight;
    imgChannel = _imgChannel;
    widthStep = imgWidth*imgChannel;
    //为直方图分配空间，并赋初始值0//
    hist = new histCell*[histSizeY];
    for(int y=0; y<histSizeY; y++)
    {
        hist[y] = new histCell[histSizeX];
        for(int x=0; x<histSizeX; x++)
        {
            hist[y][x].cellBinsFull = new double[_numOriFull];  //为一个cell进行空间分配
            hist[y][x].cellBinsHalf = new double[_numOriHalf];
            hist[y][x].dim = 4 + (_numOriFull+_numOriHalf);
            hist[y][x].feat = new double[hist[y][x].dim];
            hist[y][x].numOriFull = _numOriFull;
            hist[y][x].numOriHalf = _numOriHalf;
            //hist[y][x].normFactorFull = 0.;
            hist[y][x].normFactorHalf = 0.;
            memset(hist[y][x].cellBinsFull, 0, hist[y][x].numOriFull*sizeof(double));  //将直方图初始化为全0
            memset(hist[y][x].cellBinsHalf, 0, hist[y][x].numOriHalf*sizeof(double));
            memset(hist[y][x].feat, 0, hist[y][x].dim*sizeof(double));
        }
    }
    //为微分图像分配空间,并赋初始值0//
    dx = new int*[imgHeight];
    dy = new int*[imgHeight];
    for(int y=0; y<imgHeight; y++)
    {
        dx[y] = new int[imgWidth];
        dy[y] = new int[imgWidth];
        memset(dx[y], 0, imgWidth*sizeof(int));
        memset(dy[y], 0, imgWidth*sizeof(int));
    }
    //cout<<"hog hist intialized"<<endl;
}